

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxgeometsc.hpp
# Opt level: O2

void __thiscall
soplex::SPxGeometSC<double>::scale(SPxGeometSC<double> *this,SPxLPBase<double> *lp,bool persistent)

{
  double dVar1;
  SPxOut *pSVar2;
  pointer pdVar3;
  pointer pdVar4;
  int count;
  int t;
  char *pcVar5;
  DataArray<int> *vecExp;
  DataArray<int> *vecExp_00;
  bool bVar6;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double t_00;
  double t_01;
  double dVar7;
  double dVar8;
  double t_02;
  double t_03;
  double t_04;
  double t_05;
  double t_06;
  double t_07;
  double t_08;
  double t_09;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  undefined4 local_c4;
  Verbosity old_verbosity_2;
  undefined4 uStack_bc;
  double local_b8;
  Real local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  vector<double,_std::allocator<double>_> rowscale;
  vector<double,_std::allocator<double>_> colscale;
  double local_50;
  
  pSVar2 = (this->super_SPxScaler<double>).spxout;
  if ((pSVar2 != (SPxOut *)0x0) && (2 < (int)pSVar2->m_verbosity)) {
    colscale.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)CONCAT44(colscale.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,3);
    rowscale.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = pSVar2->m_verbosity;
    (*pSVar2->_vptr_SPxOut[2])();
    pSVar2 = soplex::operator<<((this->super_SPxScaler<double>).spxout,"Geometric scaling LP");
    pcVar5 = " (persistent)";
    if (!persistent) {
      pcVar5 = "";
    }
    pSVar2 = soplex::operator<<(pSVar2,pcVar5);
    pcVar5 = " with post-equilibration";
    if (this->postequilibration == false) {
      pcVar5 = "";
    }
    pSVar2 = soplex::operator<<(pSVar2,pcVar5);
    std::endl<char,std::char_traits<char>>(pSVar2->m_streams[pSVar2->m_verbosity]);
    pSVar2 = (this->super_SPxScaler<double>).spxout;
    (*pSVar2->_vptr_SPxOut[2])(pSVar2,&rowscale);
  }
  (**(this->super_SPxScaler<double>)._vptr_SPxScaler)(this,lp);
  (*(this->super_SPxScaler<double>)._vptr_SPxScaler[0x33])(this,lp);
  local_a0 = extraout_XMM0_Qa;
  (*(this->super_SPxScaler<double>)._vptr_SPxScaler[0x34])(this,lp);
  local_a8 = extraout_XMM0_Qa_00;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&rowscale,
             &(this->super_SPxScaler<double>)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  local_b0 = Tolerances::epsilon((Tolerances *)
                                 CONCAT44(rowscale.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start._4_4_,
                                          (Verbosity)
                                          rowscale.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &rowscale.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish);
  dVar9 = local_a8;
  if (local_a8 <= local_a0) {
    dVar9 = local_a0;
  }
  pSVar2 = (this->super_SPxScaler<double>).spxout;
  if ((pSVar2 != (SPxOut *)0x0) && (3 < (int)pSVar2->m_verbosity)) {
    colscale.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)CONCAT44(colscale.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,4);
    rowscale.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start._0_4_ = pSVar2->m_verbosity;
    (*pSVar2->_vptr_SPxOut[2])();
    pSVar2 = soplex::operator<<((this->super_SPxScaler<double>).spxout,"before scaling:");
    pSVar2 = soplex::operator<<(pSVar2," min= ");
    (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[3])(lp,1);
    pSVar2 = soplex::operator<<(pSVar2,t_00);
    pSVar2 = soplex::operator<<(pSVar2," max= ");
    (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[4])(lp,1);
    pSVar2 = soplex::operator<<(pSVar2,t_01);
    pSVar2 = soplex::operator<<(pSVar2," col-ratio= ");
    pSVar2 = soplex::operator<<(pSVar2,local_a0);
    pSVar2 = soplex::operator<<(pSVar2," row-ratio= ");
    pSVar2 = soplex::operator<<(pSVar2,local_a8);
    std::endl<char,std::char_traits<char>>(pSVar2->m_streams[pSVar2->m_verbosity]);
    pSVar2 = (this->super_SPxScaler<double>).spxout;
    (*pSVar2->_vptr_SPxOut[2])(pSVar2,&rowscale);
  }
  local_b8 = this->m_goodEnoughRatio;
  if (dVar9 <= local_b8) {
    pSVar2 = (this->super_SPxScaler<double>).spxout;
    if ((pSVar2 != (SPxOut *)0x0) && (3 < (int)pSVar2->m_verbosity)) {
      colscale.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT44(colscale.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,4);
      rowscale.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = pSVar2->m_verbosity;
      (*pSVar2->_vptr_SPxOut[2])();
      pSVar2 = soplex::operator<<((this->super_SPxScaler<double>).spxout,
                                  "No geometric scaling done, ratio good enough");
      std::endl<char,std::char_traits<char>>(pSVar2->m_streams[pSVar2->m_verbosity]);
      pSVar2 = (this->super_SPxScaler<double>).spxout;
      (*pSVar2->_vptr_SPxOut[2])(pSVar2,&rowscale);
    }
    if (this->postequilibration == false) {
      lp->_isScaled = true;
      return;
    }
    pSVar2 = (this->super_SPxScaler<double>).spxout;
    if ((pSVar2 != (SPxOut *)0x0) && (3 < (int)pSVar2->m_verbosity)) {
      colscale.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT44(colscale.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,4);
      rowscale.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = pSVar2->m_verbosity;
      (*pSVar2->_vptr_SPxOut[2])();
      pSVar2 = soplex::operator<<((this->super_SPxScaler<double>).spxout,
                                  " ... but will still perform equilibrium scaling");
      std::endl<char,std::char_traits<char>>(pSVar2->m_streams[pSVar2->m_verbosity]);
      pSVar2 = (this->super_SPxScaler<double>).spxout;
      (*pSVar2->_vptr_SPxOut[2])(pSVar2,&rowscale);
    }
  }
  colscale.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&DAT_3ff0000000000000;
  std::vector<double,_std::allocator<double>_>::vector
            (&rowscale,
             (ulong)(uint)(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum,
             (value_type_conflict1 *)&colscale,(allocator_type *)&old_verbosity_2);
  _old_verbosity_2 = 1.0;
  std::vector<double,_std::allocator<double>_>::vector
            (&colscale,
             (ulong)(uint)(lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum,
             (value_type_conflict1 *)&old_verbosity_2,(allocator_type *)&local_c4);
  if (dVar9 <= local_b8) {
LAB_001c5fd6:
    bVar6 = this->postequilibration == false;
    if (bVar6) {
      pSVar2 = (this->super_SPxScaler<double>).spxout;
      if ((pSVar2 != (SPxOut *)0x0) && (3 < (int)pSVar2->m_verbosity)) {
        _old_verbosity_2 = (value_type_conflict1)CONCAT44(uStack_bc,pSVar2->m_verbosity);
        local_c4 = 4;
        (*pSVar2->_vptr_SPxOut[2])();
        pSVar2 = soplex::operator<<((this->super_SPxScaler<double>).spxout,
                                    "No geometric scaling done.");
        std::endl<char,std::char_traits<char>>(pSVar2->m_streams[pSVar2->m_verbosity]);
        pSVar2 = (this->super_SPxScaler<double>).spxout;
        (*pSVar2->_vptr_SPxOut[2])(pSVar2,&old_verbosity_2);
      }
      lp->_isScaled = true;
      goto LAB_001c62b9;
    }
    vecExp = (this->super_SPxScaler<double>).m_activeColscaleExp;
    vecExp_00 = (this->super_SPxScaler<double>).m_activeRowscaleExp;
    if (!bVar6) {
      for (pdVar3 = (pointer)CONCAT44(rowscale.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start._4_4_,
                                      (Verbosity)
                                      rowscale.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
          pdVar4 = colscale.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start,
          pdVar3 != rowscale.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish; pdVar3 = pdVar3 + 1) {
        *pdVar3 = 1.0;
      }
      for (; pdVar4 != colscale.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish; pdVar4 = pdVar4 + 1) {
        *pdVar4 = 1.0;
      }
      goto LAB_001c6082;
    }
LAB_001c6099:
    SPxScaler<double>::computeExpVec(&this->super_SPxScaler<double>,&colscale,vecExp);
    SPxScaler<double>::computeExpVec(&this->super_SPxScaler<double>,&rowscale,vecExp_00);
  }
  else {
    dVar7 = local_a0;
    if (local_a8 <= local_a0) {
      dVar7 = local_a8;
    }
    t = 0;
    dVar12 = 0.0;
    local_b8 = 0.0;
    dVar1 = dVar9;
    local_50 = dVar7;
    do {
      dVar10 = dVar1;
      if (this->m_maxIterations <= t) {
        dVar8 = this->m_minImprovement;
        break;
      }
      if (local_a8 <= local_a0) {
        local_98 = computeScalingVec<double>((SVSetBase<double> *)lp,&colscale,&rowscale,local_b0);
        local_b8 = computeScalingVec<double>
                             (&(lp->super_LPColSetBase<double>).super_SVSetBase<double>,&rowscale,
                              &colscale,local_b0);
        dVar12 = local_98;
        local_90 = local_b8;
      }
      else {
        local_90 = computeScalingVec<double>
                             (&(lp->super_LPColSetBase<double>).super_SVSetBase<double>,&rowscale,
                              &colscale,local_b0);
        local_b8 = computeScalingVec<double>((SVSetBase<double> *)lp,&colscale,&rowscale,local_b0);
        dVar12 = local_90;
        local_98 = local_b8;
      }
      pSVar2 = (this->super_SPxScaler<double>).spxout;
      if ((pSVar2 != (SPxOut *)0x0) && (4 < (int)pSVar2->m_verbosity)) {
        _old_verbosity_2 = (value_type_conflict1)CONCAT44(uStack_bc,pSVar2->m_verbosity);
        local_c4 = 5;
        (*pSVar2->_vptr_SPxOut[2])(pSVar2,&local_c4);
        pSVar2 = soplex::operator<<((this->super_SPxScaler<double>).spxout,
                                    "Geometric scaling round ");
        pSVar2 = soplex::operator<<(pSVar2,t);
        pSVar2 = soplex::operator<<(pSVar2," col-ratio= ");
        pSVar2 = soplex::operator<<(pSVar2,local_90);
        pSVar2 = soplex::operator<<(pSVar2," row-ratio= ");
        pSVar2 = soplex::operator<<(pSVar2,local_98);
        std::endl<char,std::char_traits<char>>(pSVar2->m_streams[pSVar2->m_verbosity]);
        pSVar2 = (this->super_SPxScaler<double>).spxout;
        (*pSVar2->_vptr_SPxOut[2])(pSVar2,&old_verbosity_2);
      }
      dVar8 = this->m_minImprovement;
      dVar11 = local_50 * dVar8;
      t = t + 1;
      dVar1 = local_b8;
      local_50 = dVar12;
    } while ((dVar12 <= dVar11) || (local_b8 <= dVar10 * dVar8));
    if ((dVar7 * dVar8 < dVar12) && (dVar9 * dVar8 < local_b8)) goto LAB_001c5fd6;
    vecExp = (this->super_SPxScaler<double>).m_activeColscaleExp;
    vecExp_00 = (this->super_SPxScaler<double>).m_activeRowscaleExp;
    if ((this->postequilibration & 1U) == 0) goto LAB_001c6099;
LAB_001c6082:
    SPxEquiliSC<double>::computePostequiExpVecs(lp,&rowscale,&colscale,vecExp_00,vecExp,local_b0);
  }
  (*(this->super_SPxScaler<double>)._vptr_SPxScaler[2])(this,lp);
  pSVar2 = (this->super_SPxScaler<double>).spxout;
  if (pSVar2 != (SPxOut *)0x0) {
    if (4 < (int)pSVar2->m_verbosity) {
      _old_verbosity_2 = (value_type_conflict1)CONCAT44(uStack_bc,pSVar2->m_verbosity);
      local_c4 = 5;
      (*pSVar2->_vptr_SPxOut[2])();
      pSVar2 = soplex::operator<<((this->super_SPxScaler<double>).spxout,"Row scaling min= ");
      (*(this->super_SPxScaler<double>)._vptr_SPxScaler[0x31])(this);
      pSVar2 = soplex::operator<<(pSVar2,t_02);
      pSVar2 = soplex::operator<<(pSVar2," max= ");
      (*(this->super_SPxScaler<double>)._vptr_SPxScaler[0x32])(this);
      pSVar2 = soplex::operator<<(pSVar2,t_03);
      std::endl<char,std::char_traits<char>>(pSVar2->m_streams[pSVar2->m_verbosity]);
      pSVar2 = soplex::operator<<(pSVar2,"IGEOSC06 Col scaling min= ");
      (*(this->super_SPxScaler<double>)._vptr_SPxScaler[0x2f])(this);
      pSVar2 = soplex::operator<<(pSVar2,t_04);
      pSVar2 = soplex::operator<<(pSVar2," max= ");
      (*(this->super_SPxScaler<double>)._vptr_SPxScaler[0x30])(this);
      pSVar2 = soplex::operator<<(pSVar2,t_05);
      std::endl<char,std::char_traits<char>>(pSVar2->m_streams[pSVar2->m_verbosity]);
      pSVar2 = (this->super_SPxScaler<double>).spxout;
      (*pSVar2->_vptr_SPxOut[2])(pSVar2,&old_verbosity_2);
      pSVar2 = (this->super_SPxScaler<double>).spxout;
      if (pSVar2 == (SPxOut *)0x0) goto LAB_001c62b9;
    }
    if (3 < (int)pSVar2->m_verbosity) {
      _old_verbosity_2 = (value_type_conflict1)CONCAT44(uStack_bc,pSVar2->m_verbosity);
      local_c4 = 4;
      (*pSVar2->_vptr_SPxOut[2])();
      pSVar2 = soplex::operator<<((this->super_SPxScaler<double>).spxout,"after scaling: ");
      pSVar2 = soplex::operator<<(pSVar2," min= ");
      (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[3])(lp,0);
      pSVar2 = soplex::operator<<(pSVar2,t_06);
      pSVar2 = soplex::operator<<(pSVar2," max= ");
      (*(lp->super_LPRowSetBase<double>).super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[4])(lp,0);
      pSVar2 = soplex::operator<<(pSVar2,t_07);
      pSVar2 = soplex::operator<<(pSVar2," col-ratio= ");
      (*(this->super_SPxScaler<double>)._vptr_SPxScaler[0x33])(this,lp);
      pSVar2 = soplex::operator<<(pSVar2,t_08);
      pSVar2 = soplex::operator<<(pSVar2," row-ratio= ");
      (*(this->super_SPxScaler<double>)._vptr_SPxScaler[0x34])(this,lp);
      pSVar2 = soplex::operator<<(pSVar2,t_09);
      std::endl<char,std::char_traits<char>>(pSVar2->m_streams[pSVar2->m_verbosity]);
      pSVar2 = (this->super_SPxScaler<double>).spxout;
      (*pSVar2->_vptr_SPxOut[2])(pSVar2,&old_verbosity_2);
    }
  }
LAB_001c62b9:
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&colscale.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&rowscale.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void SPxGeometSC<R>::scale(SPxLPBase<R>& lp, bool persistent)
{

   SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Geometric scaling LP" <<
                 (persistent ? " (persistent)" : "") << (postequilibration ? " with post-equilibration" : "") <<
                 std::endl;)

   this->setup(lp);

   /* We want to do that direction first, with the lower ratio.
    * See SPxEquiliSC<R>::scale() for a reasoning.
    */
   const R colratio = this->maxColRatio(lp);
   const R rowratio = this->maxRowRatio(lp);
   R epsilon = this->tolerances()->epsilon();

   const bool colFirst = colratio < rowratio;

   R p0start;
   R p1start;

   if(colFirst)
   {
      p0start = colratio;
      p1start = rowratio;
   }
   else
   {
      p0start = rowratio;
      p1start = colratio;
   }

   SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "before scaling:"
                 << " min= " << lp.minAbsNzo()
                 << " max= " << lp.maxAbsNzo()
                 << " col-ratio= " << colratio
                 << " row-ratio= " << rowratio
                 << std::endl;)

   // perform geometric scaling only if maximum ratio is above threshold
   bool geoscale = p1start > m_goodEnoughRatio;

   if(!geoscale)
   {
      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "No geometric scaling done, ratio good enough" <<
                    std::endl;)

      if(!postequilibration)
      {
         lp.setScalingInfo(true);
         return;
      }

      SPX_MSG_INFO2((*this->spxout),
                    (*this->spxout) << " ... but will still perform equilibrium scaling" <<
                    std::endl;)
   }

   std::vector<R> rowscale(unsigned(lp.nRows()), 1.0);
   std::vector<R> colscale(unsigned(lp.nCols()), 1.0);

   R p0 = 0.0;
   R p1 = 0.0;

   if(geoscale)
   {
      R p0prev = p0start;
      R p1prev = p1start;

      // we make at most maxIterations.
      for(int count = 0; count < m_maxIterations; count++)
      {
         if(colFirst)
         {
            p0 = computeScalingVec(lp.colSet(), rowscale, colscale, epsilon);
            p1 = computeScalingVec(lp.rowSet(), colscale, rowscale, epsilon);
         }
         else
         {
            p0 = computeScalingVec(lp.rowSet(), colscale, rowscale, epsilon);
            p1 = computeScalingVec(lp.colSet(), rowscale, colscale, epsilon);
         }

         SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "Geometric scaling round " << count
                       << " col-ratio= " << (colFirst ? p0 : p1)
                       << " row-ratio= " << (colFirst ? p1 : p0)
                       << std::endl;)

         if(p0 > m_minImprovement * p0prev && p1 > m_minImprovement * p1prev)
            break;

         p0prev = p0;
         p1prev = p1;
      }

      // perform geometric scaling only if there is enough (default 15%) improvement.
      geoscale = (p0 <= m_minImprovement * p0start || p1 <= m_minImprovement * p1start);
   }

   if(!geoscale && !postequilibration)
   {
      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "No geometric scaling done." << std::endl;)
      lp.setScalingInfo(true);
   }
   else
   {
      DataArray<int>& colscaleExp = *this->m_activeColscaleExp;
      DataArray<int>& rowscaleExp = *this->m_activeRowscaleExp;

      if(postequilibration)
      {
         if(!geoscale)
         {
            std::fill(rowscale.begin(), rowscale.end(), 1.0);
            std::fill(colscale.begin(), colscale.end(), 1.0);
         }

         SPxEquiliSC<R>::computePostequiExpVecs(lp, rowscale, colscale, rowscaleExp, colscaleExp, epsilon);
      }
      else
      {
         this->computeExpVec(colscale, colscaleExp);
         this->computeExpVec(rowscale, rowscaleExp);
      }

      this->applyScaling(lp);

      SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "Row scaling min= " << this->minAbsRowscale()
                    << " max= " << this->maxAbsRowscale()
                    << std::endl
                    << "IGEOSC06 Col scaling min= " << this->minAbsColscale()
                    << " max= " << this->maxAbsColscale()
                    << std::endl;)

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "after scaling: "
                    << " min= " << lp.minAbsNzo(false)
                    << " max= " << lp.maxAbsNzo(false)
                    << " col-ratio= " << this->maxColRatio(lp)
                    << " row-ratio= " << this->maxRowRatio(lp)
                    << std::endl;)
   }
}